

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTestUnexpectedIndent::Run(DyndepParserTestUnexpectedIndent *this)

{
  Test *pTVar1;
  bool bVar2;
  char kInput [6];
  string err;
  DyndepParser parser;
  allocator<char> local_121;
  char local_120 [8];
  string local_118;
  string local_f8;
  DyndepParser local_d8;
  
  builtin_strncpy(local_120," = 1\n",6);
  DyndepParser::DyndepParser
            (&local_d8,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,local_120,&local_121);
  bVar2 = DyndepParser::ParseTest(&local_d8,&local_f8,&local_118);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0xb6,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_f8);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:1: unexpected indent\n",&local_118);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0xb7,"\"input:1: unexpected indent\\n\" == err");
  std::__cxx11::string::~string((string *)&local_118);
  DyndepParser::~DyndepParser(&local_d8);
  return;
}

Assistant:

TEST_F(DyndepParserTest, UnexpectedIndent) {
  const char kInput[] =
" = 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: unexpected indent\n", err);
}